

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O3

istream * spvtools::utils::
          ParseNormalFloat<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>
                    (istream *is,bool negate_value,
                    HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                    *value)

{
  int iVar1;
  uint_type uVar2;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,negate_value) == 0) {
    std::istream::_M_extract<double>((double *)is);
    uVar2 = 0;
  }
  else {
    iVar1 = std::istream::peek();
    if ((iVar1 == 0x2b) || (iVar1 == 0x2d)) {
      (value->value_).data_ = 0;
      std::ios::clear((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
      if ((iVar1 - 0x2bU & 0xfffffffd) == 0) {
        return is;
      }
    }
    std::istream::_M_extract<double>((double *)is);
    uVar2 = 0x8000000000000000;
  }
  (value->value_).data_ = uVar2;
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
    (value->value_).data_ = 0;
  }
  return is;
}

Assistant:

inline std::istream& ParseNormalFloat(std::istream& is, bool negate_value,
                                      HexFloat<T, Traits>& value) {
  if (RejectParseDueToLeadingSign(is, negate_value, value)) {
    return is;
  }
  T val;
  is >> val;
  if (negate_value) {
    val = -val;
  }
  value.set_value(val);
  // In the failure case, map -0.0 to 0.0.
  if (is.fail() && value.getUnsignedBits() == 0u) {
    value = HexFloat<T, Traits>(typename HexFloat<T, Traits>::uint_type{0});
  }
  if (val.isInfinity()) {
    // Fail the parse.  Emulate standard behaviour by setting the value to
    // the closest normal value, and set the fail bit on the stream.
    value.set_value((value.isNegative() | negate_value) ? T::lowest()
                                                        : T::max());
    is.setstate(std::ios_base::failbit);
  }
  return is;
}